

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall BasicBlock::MergePredBlocksValueMaps(BasicBlock *this,GlobOpt *globOpt)

{
  Type *this_00;
  Type TVar1;
  int iVar2;
  Func *pFVar3;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *obj;
  PathDependentInfo *pPVar4;
  Type pSVar5;
  Type pFVar6;
  JitArenaAllocator *pJVar7;
  SymTable *pSVar8;
  Type pJVar9;
  long lVar10;
  code *pcVar11;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  uint functionId;
  undefined4 *puVar15;
  Type_conflict pBVar16;
  Type *ppFVar17;
  BailOutInfo *pBVar18;
  Value *pVVar19;
  Loop *pLVar20;
  StackSym *pSVar21;
  ValueInfo *pVVar22;
  Loop *pLVar23;
  StackSym *pSVar24;
  BasicBlock *pBVar25;
  Type *ppFVar26;
  BasicBlock *toBlockContext;
  BVSparse<Memory::JitArenaAllocator> *pBVar27;
  BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  Loop *pLVar28;
  BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge;
  ValueInfo *pVVar29;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar30;
  BasicBlock *pBVar31;
  uint uVar32;
  Loop *loop;
  PathDependentInfoToRestore PVar33;
  PathDependentInfoToRestore infoToRestore;
  undefined1 local_240 [8];
  EditingIterator iter;
  GlobOptBlockData blockData;
  undefined1 auStack_148 [8];
  BVSparse<Memory::JitArenaAllocator> symsRequiringCompensation;
  BVSparse<Memory::JitArenaAllocator> symsNeedingLosslessIntConversion;
  BVSparse<Memory::JitArenaAllocator> symsNeedingFloatConversion;
  SymToValueInfoMap symsRequiringCompensationToMergedValueInfoMap;
  Iterator local_a8;
  GlobOptBlockData *local_98;
  Loop *local_90;
  Loop *local_88;
  Loop *local_80;
  undefined1 auStack_78 [8];
  BVSparse<Memory::JitArenaAllocator> symsNeedingLossyIntConversion;
  PageAllocator *local_50;
  
  uVar32 = *(uint *)&globOpt->field_0xf4;
  if ((uVar32 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar15 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                        ,0x132f,"(!globOpt->isCallHelper)","!globOpt->isCallHelper");
    if (!bVar12) goto LAB_0040147a;
    *puVar15 = 0;
    uVar32 = *(uint *)&globOpt->field_0xf4;
  }
  local_98 = &this->globOptData;
  iter.last = (NodeBase *)0x0;
  if ((uVar32 & 0x20) != 0) {
    GlobOptBlockData::CopyBlockData((GlobOptBlockData *)&iter.last,local_98);
    return;
  }
  GlobOptBlockData::NullOutBlockData((GlobOptBlockData *)&iter.last,globOpt,globOpt->func);
  symsRequiringCompensation.lastFoundIndex = (Type_conflict)globOpt->tempAlloc;
  symsRequiringCompensation.alloc = (Type)auStack_148;
  auStack_148 = (undefined1  [8])0x0;
  symsRequiringCompensation.head = (Type_conflict)0x0;
  symsNeedingFloatConversion.lastUsedNodePrevNextField = (Type)0x0;
  pBVar16 = (Type_conflict)&this->predList;
  bVar12 = true;
  auStack_78 = (undefined1  [8])pBVar16;
  symsNeedingLossyIntConversion.head = pBVar16;
  puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  symsNeedingLossyIntConversion.lastUsedNodePrevNextField = (Type)pBVar16;
  while( true ) {
    if (pBVar16 == (Type_conflict)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar15 = 1;
      bVar13 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                          ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar13) goto LAB_0040147a;
      *puVar15 = 0;
      pBVar16 = symsNeedingLossyIntConversion.head;
    }
    pFVar3 = (Func *)(((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)&pBVar16->next)->
                     super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])pFVar3 == auStack_78) break;
    symsNeedingLossyIntConversion.head = (Type_conflict)pFVar3;
    ppFVar17 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)auStack_78);
    pBVar31 = (*ppFVar17)->predBlock;
    if (pBVar31 == (BasicBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar15 = 1;
      bVar13 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x1343,"(pred)","pred");
      if (!bVar13) goto LAB_0040147a;
      *puVar15 = 0;
    }
    obj = (pBVar31->globOptData).callSequence;
    if ((obj != (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
       ((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
        (obj->super_SListNodeBase<Memory::ArenaAllocator>).next == obj)) {
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,SListBase<IR::Opnd*,Memory::ArenaAllocator,RealCount>>
                (globOpt->alloc,obj);
      (pBVar31->globOptData).callSequence =
           (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    }
    if (((((this->field_0x18 & 4) == 0) || (globOpt->prePassLoop == (Loop *)0x0)) ||
        (globOpt->prePassLoop != this->loop)) ||
       (bVar13 = Loop::IsDescendentOrSelf(this->loop,pBVar31->loop),
       pBVar16 = symsNeedingLossyIntConversion.head, !bVar13)) {
      pPVar4 = (*ppFVar17)->pathDependentInfo;
      if (pPVar4 == (PathDependentInfo *)0x0) {
        PVar33.rightValueInfo = (ValueInfo *)0x0;
        PVar33.leftValueInfo = (ValueInfo *)*ppFVar17;
        pVVar22 = (ValueInfo *)0x0;
      }
      else {
        PVar33 = GlobOpt::UpdatePathDependentInfo(globOpt,pPVar4);
        pVVar22 = PVar33.leftValueInfo;
      }
      pVVar29 = PVar33.rightValueInfo;
      if (pBVar31->dataUseCount == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar13 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                            ,0x1359,"(pred->GetDataUseCount())","pred->GetDataUseCount()");
        if (!bVar13) goto LAB_0040147a;
        *puVar15 = 0;
      }
      if (iter.last == (NodeBase *)0x0) {
        pSVar5 = (pBVar31->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
        if ((((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar5 == &pBVar31->succList)
            || ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar5->next !=
                &pBVar31->succList)) ||
           ((*symsNeedingLossyIntConversion.lastUsedNodePrevNextField ==
             (BVSparseNode<Memory::JitArenaAllocator> *)
             symsNeedingLossyIntConversion.lastUsedNodePrevNextField ||
            (((*symsNeedingLossyIntConversion.lastUsedNodePrevNextField)->next !=
              (Type)symsNeedingLossyIntConversion.lastUsedNodePrevNextField ||
             (this->loop != (Loop *)0x0)))))) {
          GlobOptBlockData::CloneBlockData((GlobOptBlockData *)&iter.last,this,pBVar31);
        }
        else {
          GlobOptBlockData::ReuseBlockData((GlobOptBlockData *)&iter.last,&pBVar31->globOptData);
          pVVar29 = (ValueInfo *)0x0;
          pVVar22 = (ValueInfo *)0x0;
        }
      }
      else {
        bVar13 = globOpt->prePassLoop == (Loop *)0x0;
        pBVar27 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        if (bVar13) {
          pBVar27 = (BVSparse<Memory::JitArenaAllocator> *)auStack_148;
        }
        symsCreatedForMerge = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        if (bVar13) {
          symsCreatedForMerge =
               (BVSparse<Memory::JitArenaAllocator> *)
               &symsNeedingFloatConversion.lastUsedNodePrevNextField;
        }
        GlobOptBlockData::MergeBlockData
                  ((GlobOptBlockData *)&iter.last,this,pBVar31,pBVar27,symsCreatedForMerge,bVar12);
        bVar12 = false;
      }
      pBVar16 = symsNeedingLossyIntConversion.head;
      if (pPVar4 != (PathDependentInfo *)0x0) {
        infoToRestore.rightValueInfo = pVVar29;
        infoToRestore.leftValueInfo = pVVar22;
        GlobOpt::RestorePathDependentInfo(globOpt,pPVar4,infoToRestore);
        pFVar6 = *ppFVar17;
        pJVar7 = globOpt->alloc;
        pPVar4 = pFVar6->pathDependentInfo;
        pPVar4->leftValue = (Value *)pJVar7->bvFreeList;
        pJVar7->bvFreeList = (BVSparseNode *)pPVar4;
        pFVar6->pathDependentInfo = (PathDependentInfo *)0x0;
        pBVar16 = symsNeedingLossyIntConversion.head;
      }
    }
  }
  BVSparse<Memory::JitArenaAllocator>::~BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)
             &symsNeedingFloatConversion.lastUsedNodePrevNextField);
  if (iter.last == (NodeBase *)0x0) {
    GlobOptBlockData::InitBlockData((GlobOptBlockData *)&iter.last,globOpt,globOpt->func);
  }
  bVar12 = GlobOpt::DoObjTypeSpec(globOpt);
  if (!bVar12) {
    GlobOpt::KillAllObjectTypes(globOpt,(this->globOptData).liveFields);
  }
  GlobOptBlockData::CopyBlockData(local_98,(GlobOptBlockData *)&iter.last);
  if (globOpt->prePassLoop == (Loop *)0x0) {
    CleanUpValueMaps(this);
    JsUtil::
    BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary((BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      *)&symsNeedingFloatConversion.lastUsedNodePrevNextField,globOpt->tempAlloc,0);
    local_50 = (PageAllocator *)auStack_148;
    bVar12 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                       ((BVSparse<Memory::JitArenaAllocator> *)local_50);
    if (!bVar12) {
      pSVar8 = this->func->m_symTable;
      while (local_50 = (PageAllocator *)local_50->_vptr_PageAllocatorBase,
            local_50 != (PageAllocator *)0x0) {
        TVar1 = *(Type *)&(local_50->super_PageAllocatorBaseCommon).virtualAllocator;
        auStack_78 = (undefined1  [8])
                     ((Type *)&(local_50->super_PageAllocatorBaseCommon).allocatorType)->word;
        while (auStack_78 != (undefined1  [8])0x0) {
          lVar10 = 0;
          if (auStack_78 != (undefined1  [8])0x0) {
            for (; ((ulong)auStack_78 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
            }
          }
          uVar32 = -(uint)(auStack_78 == (undefined1  [8])0x0) | (uint)lVar10;
          BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)auStack_78,uVar32);
          symsRequiringCompensation.lastUsedNodePrevNextField =
               (Type)SymTable::Find(pSVar8,uVar32 + TVar1);
          if ((Sym *)symsRequiringCompensation.lastUsedNodePrevNextField == (Sym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar12 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                ,0x13b1,"(sym)","sym");
            if (!bVar12) goto LAB_0040147a;
            *puVar15 = 0;
          }
          pVVar19 = GlobOptBlockData::FindValue
                              ((GlobOptBlockData *)&iter.last,
                               (Sym *)symsRequiringCompensation.lastUsedNodePrevNextField);
          if (pVVar19 != (Value *)0x0) {
            symsNeedingLosslessIntConversion.lastUsedNodePrevNextField = (Type)pVVar19->valueInfo;
            bVar12 = ValueInfo::IsArrayValueInfo
                               ((ValueInfo *)
                                symsNeedingLosslessIntConversion.lastUsedNodePrevNextField);
            if (bVar12) {
              JsUtil::
              BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::
              Insert<(JsUtil::BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                        ((BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)&symsNeedingFloatConversion.lastUsedNodePrevNextField,
                         (Sym **)&symsRequiringCompensation.lastUsedNodePrevNextField,
                         (ValueInfo **)&symsNeedingLosslessIntConversion.lastUsedNodePrevNextField);
            }
          }
        }
      }
      BVSparse<Memory::JitArenaAllocator>::ClearAll
                ((BVSparse<Memory::JitArenaAllocator> *)auStack_148);
    }
    if ((this->field_0x18 & 4) != 0) {
      local_88 = (Loop *)globOpt->tempBv;
      bVar12 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                         ((BVSparse<Memory::JitArenaAllocator> *)local_88);
      if (!bVar12) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                            ,0x13d0,"(tempBv->IsEmpty())","tempBv->IsEmpty()");
        if (!bVar12) goto LAB_0040147a;
        *puVar15 = 0;
      }
      pLVar20 = local_88;
      pLVar28 = this->loop;
      pSVar8 = this->func->m_symTable;
      pJVar7 = globOpt->alloc;
      BVSparse<Memory::JitArenaAllocator>::Or
                ((BVSparse<Memory::JitArenaAllocator> *)local_88,
                 pLVar28->likelyIntSymsUsedBeforeDefined,pLVar28->symsDefInLoop);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
                ((BVSparse<Memory::JitArenaAllocator> *)pLVar20,
                 (BVSparse<Memory::JitArenaAllocator> *)0x0);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                ((BVSparse<Memory::JitArenaAllocator> *)pLVar20,
                 (BVSparse<Memory::JitArenaAllocator> *)0x0);
      pLVar23 = pLVar20;
      local_80 = pLVar28;
      while (pLVar28 = local_80, pLVar20 = *(Loop **)pLVar20, pLVar20 != (Loop *)0x0) {
        iVar2 = *(int *)&pLVar20->headBlock;
        auStack_78 = (undefined1  [8])pLVar20->topFunc;
        local_90 = pLVar20;
        while (pLVar20 = local_90, pLVar23 = local_88, auStack_78 != (undefined1  [8])0x0) {
          lVar10 = 0;
          if (auStack_78 != (undefined1  [8])0x0) {
            for (; ((ulong)auStack_78 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
            }
          }
          uVar32 = -(uint)(auStack_78 == (undefined1  [8])0x0) | (uint)lVar10;
          BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)auStack_78,uVar32);
          pSVar21 = SymTable::FindStackSym(pSVar8,uVar32 + iVar2);
          if (pSVar21 == (StackSym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar12 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                ,0x13dc,"(varSym)","varSym");
            if (!bVar12) goto LAB_0040147a;
            *puVar15 = 0;
          }
          pVVar19 = GlobOptBlockData::FindValue((GlobOptBlockData *)&iter.last,&pSVar21->super_Sym);
          if (pVVar19 == (Value *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar12 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                ,0x13de,"(value)","value");
            if (!bVar12) goto LAB_0040147a;
            *puVar15 = 0;
          }
          pVVar22 = pVVar19->valueInfo;
          bVar12 = ValueType::IsInt(&pVVar22->super_ValueType);
          if (!bVar12) {
            pVVar22 = ValueInfo::SpecializeToInt32(pVVar22,pJVar7,false);
            GlobOpt::ChangeValueInfo(globOpt,(BasicBlock *)0x0,pVVar19,pVVar22,false,false);
          }
        }
      }
      BVSparse<Memory::JitArenaAllocator>::Or
                ((BVSparse<Memory::JitArenaAllocator> *)pLVar23,
                 local_80->likelyNumberSymsUsedBeforeDefined,local_80->symsDefInLoop);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                ((BVSparse<Memory::JitArenaAllocator> *)pLVar23,pLVar28->forceFloat64SymsOnEntry);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
                ((BVSparse<Memory::JitArenaAllocator> *)pLVar23,
                 (BVSparse<Memory::JitArenaAllocator> *)0x0);
      local_90 = (Loop *)&pLVar28->landingPad->globOptData;
      pLVar28 = pLVar23;
      while (pLVar23 = *(Loop **)pLVar23, pLVar23 != (Loop *)0x0) {
        iVar2 = *(int *)&pLVar23->headBlock;
        auStack_78 = (undefined1  [8])pLVar23->topFunc;
        local_80 = pLVar23;
        while (pLVar23 = local_80, pLVar28 = local_88, auStack_78 != (undefined1  [8])0x0) {
          lVar10 = 0;
          if (auStack_78 != (undefined1  [8])0x0) {
            for (; ((ulong)auStack_78 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
            }
          }
          uVar32 = -(uint)(auStack_78 == (undefined1  [8])0x0) | (uint)lVar10;
          BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)auStack_78,uVar32);
          pSVar21 = SymTable::FindStackSym(pSVar8,uVar32 + iVar2);
          if (pSVar21 == (StackSym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar12 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                ,0x13ee,"(varSym)","varSym");
            if (!bVar12) goto LAB_0040147a;
            *puVar15 = 0;
          }
          pSVar24 = StackSym::GetFloat64EquivSym(pSVar21,(Func *)0x0);
          if (((pSVar24 == (StackSym *)0x0) || ((pSVar24->field_0x1a & 2) != 0)) ||
             (bVar12 = GlobOptBlockData::IsFloat64TypeSpecialized
                                 ((GlobOptBlockData *)local_90,&pSVar21->super_Sym), !bVar12)) {
            pVVar19 = GlobOptBlockData::FindValue
                                ((GlobOptBlockData *)&iter.last,&pSVar21->super_Sym);
            if (pVVar19 == (Value *)0x0) {
              pVVar19 = GlobOpt::NewGenericValue(globOpt,(ValueType)0x108);
              GlobOptBlockData::SetValue(local_98,pVVar19,&pSVar21->super_Sym);
            }
            else {
              pVVar22 = pVVar19->valueInfo;
              bVar12 = ValueType::IsNumber(&pVVar22->super_ValueType);
              if (!bVar12) {
                pVVar22 = ValueInfo::SpecializeToFloat64(pVVar22,pJVar7);
                GlobOpt::ChangeValueInfo(globOpt,this,pVVar19,pVVar22,false,false);
              }
            }
          }
        }
      }
      BVSparse<Memory::JitArenaAllocator>::ClearAll((BVSparse<Memory::JitArenaAllocator> *)pLVar28);
    }
    bVar12 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(globOpt->tempBv);
    if (!bVar12) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar15 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x1413,"(globOpt->tempBv->IsEmpty())","globOpt->tempBv->IsEmpty()");
      if (!bVar12) goto LAB_0040147a;
      *puVar15 = 0;
    }
    symsNeedingLosslessIntConversion.lastFoundIndex = (Type_conflict)globOpt->tempAlloc;
    auStack_78 = (undefined1  [8])0x0;
    symsNeedingLossyIntConversion.head = (Type_conflict)0x0;
    symsNeedingLossyIntConversion.alloc = (Type)auStack_78;
    this_00 = &symsRequiringCompensation.lastUsedNodePrevNextField;
    symsRequiringCompensation.lastUsedNodePrevNextField = (Type)0x0;
    symsNeedingLosslessIntConversion.head = (Type_conflict)0x0;
    symsNeedingFloatConversion.alloc =
         (Type)&symsNeedingLosslessIntConversion.lastUsedNodePrevNextField;
    symsNeedingLosslessIntConversion.lastUsedNodePrevNextField = (Type)0x0;
    symsNeedingFloatConversion.head = (Type_conflict)0x0;
    local_240 = (undefined1  [8])symsNeedingLossyIntConversion.lastUsedNodePrevNextField;
    iter.super_Iterator.list =
         (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
         symsNeedingLossyIntConversion.lastUsedNodePrevNextField;
    iter.super_Iterator.current = (NodeBase *)0x0;
    symsNeedingLosslessIntConversion.alloc = (Type)this_00;
    symsNeedingFloatConversion.lastFoundIndex = symsNeedingLosslessIntConversion.lastFoundIndex;
    symsNeedingLossyIntConversion.lastFoundIndex = symsNeedingLosslessIntConversion.lastFoundIndex;
    while (bVar12 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                              ((EditingIterator *)local_240), bVar12) {
      ppFVar17 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)local_240);
      pBVar31 = (*ppFVar17)->predBlock;
      if ((pBVar31->loop == (Loop *)0x0) ||
         (pBVar25 = Loop::GetHeadBlock(pBVar31->loop), pBVar25 != this)) {
        if ((pBVar31->field_0x18 & 0x40) == 0) {
          toBlockContext = (BasicBlock *)0x0;
          pBVar25 = pBVar31;
        }
        else {
          pSVar30 = &pBVar31->predList;
          pSVar5 = (pBVar31->predList).
                   super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
                   super_SListNodeBase<Memory::ArenaAllocator>.next;
          if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar5 == pSVar30) ||
             ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar5->next != pSVar30)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar12 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                ,0x1427,"(pred->GetPredList()->HasOne())",
                                "pred->GetPredList()->HasOne()");
            if (!bVar12) goto LAB_0040147a;
            *puVar15 = 0;
          }
          ppFVar26 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Head
                               (&pSVar30->
                                 super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
          pBVar25 = (*ppFVar26)->predBlock;
          toBlockContext = pBVar31;
        }
        BVSparse<Memory::JitArenaAllocator>::Minus
                  ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,
                   (BVSparse<Memory::JitArenaAllocator> *)0x0,(pBVar25->globOptData).liveInt32Syms);
        BVSparse<Memory::JitArenaAllocator>::Minus
                  ((BVSparse<Memory::JitArenaAllocator> *)this_00,
                   (BVSparse<Memory::JitArenaAllocator> *)0x0,
                   (BVSparse<Memory::JitArenaAllocator> *)0x0);
        BVSparse<Memory::JitArenaAllocator>::Minus
                  (globOpt->tempBv,(pBVar25->globOptData).liveInt32Syms,
                   (pBVar25->globOptData).liveLossyInt32Syms);
        BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                  ((BVSparse<Memory::JitArenaAllocator> *)this_00,globOpt->tempBv);
        BVSparse<Memory::JitArenaAllocator>::Minus
                  (globOpt->tempBv,(BVSparse<Memory::JitArenaAllocator> *)0x0,
                   (pBVar25->globOptData).liveVarSyms);
        BVSparse<Memory::JitArenaAllocator>::Minus
                  ((BVSparse<Memory::JitArenaAllocator> *)
                   &symsNeedingLosslessIntConversion.lastUsedNodePrevNextField,
                   (BVSparse<Memory::JitArenaAllocator> *)0x0,(pBVar25->globOptData).liveFloat64Syms
                  );
        bVar12 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(globOpt->tempBv);
        if ((((!bVar12) ||
             (bVar12 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                                 ((BVSparse<Memory::JitArenaAllocator> *)auStack_78), !bVar12)) ||
            (bVar12 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                                ((BVSparse<Memory::JitArenaAllocator> *)this_00), !bVar12)) ||
           ((bVar12 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                                ((BVSparse<Memory::JitArenaAllocator> *)
                                 &symsNeedingLosslessIntConversion.lastUsedNodePrevNextField),
            !bVar12 ||
            (symsRequiringCompensationToMergedValueInfoMap.size !=
             symsRequiringCompensationToMergedValueInfoMap.count)))) {
          ppFVar26 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Head
                               (&(pBVar25->succList).
                                 super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
          if (((*ppFVar26)->succBlock != this) ||
             (((pBVar25->loop != (Loop *)0x0 && (pBVar25->loop->parent == this->loop)) &&
              (1 < (pBVar25->succList).
                   super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.
                   count)))) {
            if (toBlockContext == (BasicBlock *)0x0) {
              uVar14 = Func::GetSourceContextId(this->func);
              functionId = Func::GetLocalFunctionId(this->func);
              bVar12 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar14,functionId)
              ;
              if ((bVar12) && (globOpt->prePassLoop == (Loop *)0x0)) {
                Output::Print(L"TRACE: ");
                Output::Print(L"Inserting airlock block to convert syms to var between block %d and %d\n"
                              ,(ulong)pBVar25->number,(ulong)this->number);
                Output::Flush();
              }
              toBlockContext = FlowGraph::InsertAirlockBlock(globOpt->func->m_fg,*ppFVar17,false);
            }
            else {
              if ((toBlockContext->field_0x18 & 0x40) == 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar15 = 1;
                bVar12 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                    ,0x145a,"(orgPred->isAirLockCompensationBlock)",
                                    "orgPred->isAirLockCompensationBlock");
                if (!bVar12) goto LAB_0040147a;
                *puVar15 = 0;
              }
              DecrementDataUseCount(pBVar25);
              toBlockContext->field_0x18 = toBlockContext->field_0x18 & 0xbf;
            }
            GlobOptBlockData::CloneBlockData(&toBlockContext->globOptData,toBlockContext,pBVar25);
            pBVar25 = toBlockContext;
          }
          bVar12 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(globOpt->tempBv);
          if (!bVar12) {
            GlobOpt::ToVar(globOpt,globOpt->tempBv,pBVar25,(Instr *)0x0);
          }
          bVar12 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                             ((BVSparse<Memory::JitArenaAllocator> *)auStack_78);
          if (!bVar12) {
            GlobOpt::ToInt32(globOpt,(BVSparse<Memory::JitArenaAllocator> *)auStack_78,pBVar25,true,
                             (Instr *)0x0);
          }
          bVar12 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                             ((BVSparse<Memory::JitArenaAllocator> *)this_00);
          if (!bVar12) {
            GlobOpt::ToInt32(globOpt,(BVSparse<Memory::JitArenaAllocator> *)this_00,pBVar25,false,
                             (Instr *)0x0);
          }
          bVar12 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                             ((BVSparse<Memory::JitArenaAllocator> *)
                              &symsNeedingLosslessIntConversion.lastUsedNodePrevNextField);
          if (!bVar12) {
            GlobOpt::ToFloat64(globOpt,(BVSparse<Memory::JitArenaAllocator> *)
                                       &symsNeedingLosslessIntConversion.lastUsedNodePrevNextField,
                               pBVar25);
          }
          if (symsRequiringCompensationToMergedValueInfoMap.size !=
              symsRequiringCompensationToMergedValueInfoMap.count) {
            GlobOpt::InsertValueCompensation
                      (globOpt,pBVar25,this,
                       (SymToValueInfoMap *)&symsNeedingFloatConversion.lastUsedNodePrevNextField);
          }
        }
      }
      else {
        DecrementDataUseCount(pBVar31);
      }
    }
    local_a8.list =
         (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
         symsNeedingLossyIntConversion.lastUsedNodePrevNextField;
    local_a8.current = (NodeBase *)symsNeedingLossyIntConversion.lastUsedNodePrevNextField;
    while( true ) {
      if (local_a8.current == (NodeBase *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                            ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar12) goto LAB_0040147a;
        *puVar15 = 0;
      }
      if ((BVSparseNode<Memory::JitArenaAllocator> *)(local_a8.current)->next ==
          (BVSparseNode<Memory::JitArenaAllocator> *)local_a8.list) break;
      local_a8.current = (NodeBase *)(local_a8.current)->next;
      ppFVar17 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_a8)
      ;
      pBVar31 = (*ppFVar17)->predBlock;
      if (((this->field_0x18 & 4) == 0) || (this->loop != pBVar31->loop)) {
        if ((pBVar31->field_0x18 & 0x40) != 0) {
          DecrementDataUseCount(pBVar31);
          pSVar5 = (pBVar31->predList).
                   super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
                   super_SListNodeBase<Memory::ArenaAllocator>.next;
          pSVar30 = &pBVar31->predList;
          if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar5 == pSVar30) ||
             ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar5->next != pSVar30)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar12 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                ,0x148c,"(pred->GetPredList()->HasOne())",
                                "pred->GetPredList()->HasOne()");
            if (!bVar12) goto LAB_0040147a;
            *puVar15 = 0;
          }
          ppFVar17 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Head
                               (&pSVar30->
                                 super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
          pBVar31 = (*ppFVar17)->predBlock;
        }
        uVar14 = DecrementDataUseCount(pBVar31);
        if ((uVar14 == 0) &&
           ((pLVar28 = this->loop, pLVar28 == (Loop *)0x0 || (pLVar28->landingPad != pBVar31)))) {
          pSVar5 = (pBVar31->succList).
                   super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
                   super_SListNodeBase<Memory::ArenaAllocator>.next;
          if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar5 == &pBVar31->succList)
             || (((((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar5->next !=
                    &pBVar31->succList ||
                   (*symsNeedingLossyIntConversion.lastUsedNodePrevNextField ==
                    (BVSparseNode<Memory::JitArenaAllocator> *)
                    symsNeedingLossyIntConversion.lastUsedNodePrevNextField)) ||
                  (pLVar28 != (Loop *)0x0)) ||
                 ((*symsNeedingLossyIntConversion.lastUsedNodePrevNextField)->next !=
                  (Type)symsNeedingLossyIntConversion.lastUsedNodePrevNextField)))) {
            GlobOptBlockData::DeleteBlockData(&pBVar31->globOptData);
          }
          else {
            GlobOptBlockData::NullOutBlockData(&pBVar31->globOptData,globOpt,globOpt->func);
          }
        }
      }
    }
    BVSparse<Memory::JitArenaAllocator>::ClearAll(globOpt->tempBv);
    if (globOpt->prePassLoop != (Loop *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar15 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x149f,"(!globOpt->IsLoopPrePass())","!globOpt->IsLoopPrePass()");
      if (!bVar12) goto LAB_0040147a;
      *puVar15 = 0;
    }
    pLVar28 = this->loop;
    if ((this->field_0x18 & 4) == 0) {
      if (pLVar28 == (Loop *)0x0) {
        this->dataUseCount =
             (this->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
             super_RealCount.count;
      }
      else if (pLVar28->dominatingLoopCountableBlock == this) {
        GlobOpt::DetermineLoopCount(globOpt,pLVar28);
      }
    }
    else {
      pBVar27 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,globOpt->alloc,0x3d6ef4);
      pJVar9 = globOpt->alloc;
      pBVar27->head = (Type_conflict)0x0;
      pBVar27->lastFoundIndex = (Type_conflict)0x0;
      pBVar27->alloc = pJVar9;
      pBVar27->lastUsedNodePrevNextField = (Type)pBVar27;
      pLVar28->varSymsOnEntry = pBVar27;
      BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
                (pBVar27,(this->globOptData).liveVarSyms);
      pBVar27 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,globOpt->alloc,0x3d6ef4);
      pJVar9 = globOpt->alloc;
      pBVar27->head = (Type_conflict)0x0;
      pBVar27->lastFoundIndex = (Type_conflict)0x0;
      pBVar27->alloc = pJVar9;
      pBVar27->lastUsedNodePrevNextField = (Type)pBVar27;
      pLVar28->int32SymsOnEntry = pBVar27;
      BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
                (pBVar27,(this->globOptData).liveInt32Syms);
      pBVar27 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,globOpt->alloc,0x3d6ef4);
      pJVar9 = globOpt->alloc;
      pBVar27->head = (Type_conflict)0x0;
      pBVar27->lastFoundIndex = (Type_conflict)0x0;
      pBVar27->alloc = pJVar9;
      pBVar27->lastUsedNodePrevNextField = (Type)pBVar27;
      pLVar28->lossyInt32SymsOnEntry = pBVar27;
      BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
                (pBVar27,(this->globOptData).liveLossyInt32Syms);
      pBVar27 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,globOpt->alloc,0x3d6ef4);
      pJVar9 = globOpt->alloc;
      pBVar27->head = (Type_conflict)0x0;
      pBVar27->lastFoundIndex = (Type_conflict)0x0;
      pBVar27->alloc = pJVar9;
      pBVar27->lastUsedNodePrevNextField = (Type)pBVar27;
      pLVar28->float64SymsOnEntry = pBVar27;
      BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
                (pBVar27,(this->globOptData).liveFloat64Syms);
      pBVar27 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,globOpt->alloc,0x3d6ef4);
      pJVar9 = globOpt->alloc;
      pBVar27->head = (Type_conflict)0x0;
      pBVar27->lastFoundIndex = (Type_conflict)0x0;
      pBVar27->alloc = pJVar9;
      pBVar27->lastUsedNodePrevNextField = (Type)pBVar27;
      pLVar28->liveFieldsOnEntry = pBVar27;
      BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
                (pBVar27,(this->globOptData).liveFields);
      if (symsRequiringCompensationToMergedValueInfoMap.size !=
          symsRequiringCompensationToMergedValueInfoMap.count) {
        this_01 = (BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *)new<Memory::JitArenaAllocator>(0x38,globOpt->alloc,0x3d6ef4);
        JsUtil::
        BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::BaseDictionary(this_01,globOpt->alloc,0);
        pLVar28->symsRequiringCompensationToMergedValueInfoMap = this_01;
        JsUtil::
        BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        DoCopy<JsUtil::BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
                  ((BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)this_01,
                   (BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&symsNeedingFloatConversion.lastUsedNodePrevNextField);
      }
      bVar12 = GlobOpt::DoBoundCheckHoist(globOpt);
      if ((bVar12) && (pLVar28->inductionVariables != (InductionVariableSet *)0x0)) {
        GlobOpt::FinalizeInductionVariables(globOpt,pLVar28,(GlobOptBlockData *)&iter.last);
        bVar12 = GlobOpt::DoLoopCountBasedBoundCheckHoist(globOpt);
        if (bVar12) {
          GlobOpt::DetermineDominatingLoopCountableBlock(globOpt,pLVar28,this);
        }
      }
    }
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)
               &symsNeedingLosslessIntConversion.lastUsedNodePrevNextField);
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)
               &symsRequiringCompensation.lastUsedNodePrevNextField);
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_78);
    JsUtil::
    BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::~BaseDictionary((BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *)&symsNeedingFloatConversion.lastUsedNodePrevNextField);
LAB_0040145c:
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_148);
    return;
  }
  if (this->loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar15 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                        ,0x1392,"(this->loop)","this->loop");
    if (!bVar12) goto LAB_0040147a;
    *puVar15 = 0;
  }
  bVar12 = GlobOpt::DoBoundCheckHoist(globOpt);
  if (bVar12) {
    GlobOpt::SetInductionVariableValueNumbers(globOpt,(GlobOptBlockData *)&iter.last);
  }
  if (((this->field_0x18 & 4) == 0) || (globOpt->rootLoopPrePass != this->loop)) goto LAB_0040145c;
  if (this->loop->bailOutInfo != (BailOutInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar15 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                        ,0x139c,"(this->loop->bailOutInfo == nullptr)",
                        "this->loop->bailOutInfo == nullptr");
    if (!bVar12) {
LAB_0040147a:
      pcVar11 = (code *)invalidInstructionException();
      (*pcVar11)();
    }
    *puVar15 = 0;
  }
  pBVar18 = CreateLoopTopBailOutInfo(this,globOpt);
  this->loop->bailOutInfo = pBVar18;
  goto LAB_0040145c;
}

Assistant:

void
BasicBlock::MergePredBlocksValueMaps(GlobOpt* globOpt)
{
    Assert(!globOpt->isCallHelper);
    // We keep a local temporary copy for the merge
    GlobOptBlockData blockData(this->globOptData.curFunc);

    if (!globOpt->isRecursiveCallOnLandingPad)
    {
        blockData.NullOutBlockData(globOpt, globOpt->func);
    }
    else
    {
        // If we are going over the landing pad again after field PRE, just start again
        // with the value table where we left off.
        blockData.CopyBlockData(&this->globOptData);
        return;
    }

    BVSparse<JitArenaAllocator> symsRequiringCompensation(globOpt->tempAlloc);
    {
        BVSparse<JitArenaAllocator> symsCreatedForMerge(globOpt->tempAlloc);
        bool forceTypeSpecOnLoopHeader = true;
        FOREACH_PREDECESSOR_BLOCK(pred, this)
        {
            if (pred->globOptData.callSequence && pred->globOptData.callSequence->Empty())
            {
                JitAdelete(globOpt->alloc, pred->globOptData.callSequence);
                pred->globOptData.callSequence = nullptr;
            }
            if (this->isLoopHeader && globOpt->IsLoopPrePass() && globOpt->prePassLoop == this->loop && this->loop->IsDescendentOrSelf(pred->loop))
            {
                // Loop back-edge.
                // First pass on loop runs optimistically, without doing transforms.
                // Skip this edge for now.
                continue;
            }

            PathDependentInfo *const pathDependentInfo = __edge->GetPathDependentInfo();
            PathDependentInfoToRestore pathDependentInfoToRestore;
            if (pathDependentInfo)
            {
                pathDependentInfoToRestore = globOpt->UpdatePathDependentInfo(pathDependentInfo);
            }

            Assert(pred->GetDataUseCount());

            // First pred?
            if (blockData.symToValueMap == nullptr)
            {
                // Only one edge?
                if (pred->GetSuccList()->HasOne() && this->GetPredList()->HasOne() && this->loop == nullptr)
                {
                    blockData.ReuseBlockData(&pred->globOptData);

                    // Don't need to restore the old value info
                    pathDependentInfoToRestore.Clear();
                }
                else
                {
                    blockData.CloneBlockData(this, pred);
                }
            }
            else
            {
                const bool isLoopPrePass = globOpt->IsLoopPrePass();
                blockData.MergeBlockData(
                    this,
                    pred,
                    isLoopPrePass ? nullptr : &symsRequiringCompensation,
                    isLoopPrePass ? nullptr : &symsCreatedForMerge,
                    forceTypeSpecOnLoopHeader);
                forceTypeSpecOnLoopHeader = false; // can force type-spec on the loop header only for the first back edge.
            }

            // Restore the value for the next edge
            if (pathDependentInfo)
            {
                globOpt->RestorePathDependentInfo(pathDependentInfo, pathDependentInfoToRestore);
                __edge->ClearPathDependentInfo(globOpt->alloc);
            }

        } NEXT_PREDECESSOR_BLOCK;
    }

    // Consider: We can recreate values for hoisted field so it can copy prop out of the loop
    if (blockData.symToValueMap == nullptr)
    {
        blockData.InitBlockData(globOpt, globOpt->func);
    }

    if (!globOpt->DoObjTypeSpec())
    {
        // Object type specialization is off, but if copy prop is on (e.g., /force:fieldhoist) we're not clearing liveFields,
        // so we may be letting type syms slip through this block.
        globOpt->KillAllObjectTypes(this->globOptData.liveFields);
    }

    this->globOptData.CopyBlockData(&blockData);

    if (globOpt->IsLoopPrePass())
    {
        Assert(this->loop);

        if(globOpt->DoBoundCheckHoist())
        {
            globOpt->SetInductionVariableValueNumbers(&blockData);
        }

        if (this->isLoopHeader && globOpt->rootLoopPrePass == this->loop)
        {
            // Capture bail out info in case we have optimization that needs it
            Assert(this->loop->bailOutInfo == nullptr);
            this->loop->bailOutInfo = this->CreateLoopTopBailOutInfo(globOpt);
        }

        // If loop pre-pass, don't insert convert from type-spec to var
        return;
    }

    this->CleanUpValueMaps();
    Sym *symIV = nullptr;

    // Clean up the syms requiring compensation by checking the final value in the merged block to see if the sym still requires
    // compensation. All the while, create a mapping from sym to value info in the merged block. This dictionary helps avoid a
    // value lookup in the merged block per predecessor.
    SymToValueInfoMap symsRequiringCompensationToMergedValueInfoMap(globOpt->tempAlloc);
    if(!symsRequiringCompensation.IsEmpty())
    {
        const SymTable *const symTable = func->m_symTable;
        FOREACH_BITSET_IN_SPARSEBV(id, &symsRequiringCompensation)
        {
            Sym *const sym = symTable->Find(id);
            Assert(sym);

            Value *const value = blockData.FindValue(sym);
            if(!value)
            {
                continue;
            }

            ValueInfo *const valueInfo = value->GetValueInfo();
            if(!valueInfo->IsArrayValueInfo())
            {
                continue;
            }

            // At least one new sym was created while merging and associated with the merged value info, so those syms will
            // require compensation in predecessors. For now, the dead store phase is relied upon to remove compensation that is
            // dead due to no further uses of the new sym.
            symsRequiringCompensationToMergedValueInfoMap.Add(sym, valueInfo);
        } NEXT_BITSET_IN_SPARSEBV;
        symsRequiringCompensation.ClearAll();
    }

    if (this->isLoopHeader)
    {
        BVSparse<JitArenaAllocator> * tempBv = globOpt->tempBv;
        // Values on the back-edge in the prepass may be conservative for syms defined in the loop, and type specialization in
        // the prepass is not reflective of the value, but rather, is used to determine whether the sym should be specialized
        // around the loop. Additionally, some syms that are used before defined in the loop may be specialized in the loop
        // header despite not being specialized in the landing pad. Now that the type specialization bit-vectors are merged,
        // specialize the corresponding value infos in the loop header too.

        Assert(tempBv->IsEmpty());
        Loop *const loop = this->loop;
        SymTable *const symTable = func->m_symTable;
        JitArenaAllocator *const alloc = globOpt->alloc;

        // Int-specialized syms
        tempBv->Or(loop->likelyIntSymsUsedBeforeDefined, loop->symsDefInLoop);
        tempBv->And(blockData.liveInt32Syms);
        tempBv->Minus(blockData.liveLossyInt32Syms);
        FOREACH_BITSET_IN_SPARSEBV(id, tempBv)
        {
            StackSym *const varSym = symTable->FindStackSym(id);
            Assert(varSym);
            Value *const value = blockData.FindValue(varSym);
            Assert(value);
            ValueInfo *const valueInfo = value->GetValueInfo();
            if(!valueInfo->IsInt())
            {
                globOpt->ChangeValueInfo(nullptr, value, valueInfo->SpecializeToInt32(alloc));
            }
        } NEXT_BITSET_IN_SPARSEBV;

        // Float-specialized syms
        tempBv->Or(loop->likelyNumberSymsUsedBeforeDefined, loop->symsDefInLoop);
        tempBv->Or(loop->forceFloat64SymsOnEntry);
        tempBv->And(blockData.liveFloat64Syms);
        GlobOptBlockData &landingPadBlockData = loop->landingPad->globOptData;
        FOREACH_BITSET_IN_SPARSEBV(id, tempBv)
        {
            StackSym *const varSym = symTable->FindStackSym(id);
            Assert(varSym);

            // If the type-spec sym is null or if the sym is not float-specialized in the loop landing pad, the sym may have
            // been merged to float on a loop back-edge when it was live as float on the back-edge, and live as int in the loop
            // header. In this case, compensation inserted in the loop landing pad will use BailOutNumberOnly, and so it is
            // guaranteed that the value will be float. Otherwise, if the type-spec sym exists, its field can be checked to see
            // if it's prevented from being anything but a number.
            StackSym *const typeSpecSym = varSym->GetFloat64EquivSym(nullptr);
            if(!typeSpecSym ||
                typeSpecSym->m_requiresBailOnNotNumber ||
                !landingPadBlockData.IsFloat64TypeSpecialized(varSym))
            {
                Value *const value = blockData.FindValue(varSym);
                if(value)
                {
                    ValueInfo *const valueInfo = value->GetValueInfo();
                    if(!valueInfo->IsNumber())
                    {
                        globOpt->ChangeValueInfo(this, value, valueInfo->SpecializeToFloat64(alloc));
                    }
                }
                else
                {
                    this->globOptData.SetValue(globOpt->NewGenericValue(ValueType::Float), varSym);
                }
            }
        } NEXT_BITSET_IN_SPARSEBV;
        tempBv->ClearAll();
    }

    // We need to handle the case where a symbol is type-spec'd coming from some predecessors,
    // but not from others.
    //
    // We can do this by inserting the right conversion in the predecessor block, but we
    // can only do this if we are the first successor of that block, since the previous successors
    // would have already been processed.  Instead, we'll need to break the edge and insert a block
    // (airlock block) to put in the conversion code.
    Assert(globOpt->tempBv->IsEmpty());

    BVSparse<JitArenaAllocator> symsNeedingLossyIntConversion(globOpt->tempAlloc);
    BVSparse<JitArenaAllocator> symsNeedingLosslessIntConversion(globOpt->tempAlloc);
    BVSparse<JitArenaAllocator> symsNeedingFloatConversion(globOpt->tempAlloc);

    FOREACH_PREDECESSOR_EDGE_EDITING(edge, this, iter)
    {
        BasicBlock *pred = edge->GetPred();

        if (pred->loop && pred->loop->GetHeadBlock() == this)
        {
            pred->DecrementDataUseCount();
            // Skip loop back-edges. We will handle these when we get to the exit blocks.
            continue;
        }

        BasicBlock *orgPred = nullptr;
        if (pred->isAirLockCompensationBlock)
        {
            Assert(pred->GetPredList()->HasOne());
            orgPred = pred;
            pred = (pred->GetPredList()->Head())->GetPred();
        }

        // Lossy int in the merged block, and no int in the predecessor - need a lossy conversion to int
        symsNeedingLossyIntConversion.Minus(blockData.liveLossyInt32Syms, pred->globOptData.liveInt32Syms);

        // Lossless int in the merged block, and no lossless int in the predecessor - need a lossless conversion to int
        symsNeedingLosslessIntConversion.Minus(blockData.liveInt32Syms, blockData.liveLossyInt32Syms);
        globOpt->tempBv->Minus(pred->globOptData.liveInt32Syms, pred->globOptData.liveLossyInt32Syms);
        symsNeedingLosslessIntConversion.Minus(globOpt->tempBv);

        globOpt->tempBv->Minus(blockData.liveVarSyms, pred->globOptData.liveVarSyms);
        symsNeedingFloatConversion.Minus(blockData.liveFloat64Syms, pred->globOptData.liveFloat64Syms);

        bool symIVNeedsSpecializing = (symIV && !pred->globOptData.liveInt32Syms->Test(symIV->m_id) && !symsNeedingLosslessIntConversion.Test(symIV->m_id));

        if (!globOpt->tempBv->IsEmpty() ||
            !symsNeedingLossyIntConversion.IsEmpty() ||
            !symsNeedingLosslessIntConversion.IsEmpty() ||
            !symsNeedingFloatConversion.IsEmpty() ||
            symIVNeedsSpecializing ||
            symsRequiringCompensationToMergedValueInfoMap.Count() != 0)
        {
            // We can't un-specialize a symbol in a predecessor if we've already processed
            // a successor of that block. Instead, insert a new block on the flow edge
            // (an airlock block) and do the un-specialization there.
            //
            // Alternatively, the current block could be an exit block out of this loop, and so the predecessor may exit the
            // loop. In that case, if the predecessor may continue into the loop without exiting, then we need an airlock block
            // to do the appropriate conversions only on the exit path (preferring not to do the conversions inside the loop).
            // If, on the other hand, the predecessor always flows into the current block, then it always exits, so we don't need
            // an airlock block and can just do the conversions in the predecessor.
            if (pred->GetSuccList()->Head()->GetSucc() != this||
                (pred->loop && pred->loop->parent == this->loop && pred->GetSuccList()->Count() > 1))
            {
                BasicBlock *airlockBlock = nullptr;
                if (!orgPred)
                {
                    if (PHASE_TRACE(Js::GlobOptPhase, this->func) && !globOpt->IsLoopPrePass())
                    {
                        Output::Print(_u("TRACE: "));
                        Output::Print(_u("Inserting airlock block to convert syms to var between block %d and %d\n"),
                            pred->GetBlockNum(), this->GetBlockNum());
                        Output::Flush();
                    }
                    airlockBlock = globOpt->func->m_fg->InsertAirlockBlock(edge);
                }
                else
                {
                    Assert(orgPred->isAirLockCompensationBlock);
                    airlockBlock = orgPred;
                    pred->DecrementDataUseCount();
                    airlockBlock->isAirLockCompensationBlock = false; // This is airlock block now. So remove the attribute.
                }
                globOpt->CloneBlockData(airlockBlock, pred);

                pred = airlockBlock;
            }
            if (!globOpt->tempBv->IsEmpty())
            {
                globOpt->ToVar(globOpt->tempBv, pred);
            }
            if (!symsNeedingLossyIntConversion.IsEmpty())
            {
                globOpt->ToInt32(&symsNeedingLossyIntConversion, pred, true /* lossy */);
            }
            if (!symsNeedingLosslessIntConversion.IsEmpty())
            {
                globOpt->ToInt32(&symsNeedingLosslessIntConversion, pred, false /* lossy */);
            }
            if (!symsNeedingFloatConversion.IsEmpty())
            {
                globOpt->ToFloat64(&symsNeedingFloatConversion, pred);
            }
            if (symIVNeedsSpecializing)
            {
                globOpt->tempBv->ClearAll();
                globOpt->tempBv->Set(symIV->m_id);
                globOpt->ToInt32(globOpt->tempBv, pred, false /* lossy */);
            }
            if(symsRequiringCompensationToMergedValueInfoMap.Count() != 0)
            {
                globOpt->InsertValueCompensation(pred, this, &symsRequiringCompensationToMergedValueInfoMap);
            }
        }
    } NEXT_PREDECESSOR_EDGE_EDITING;

    FOREACH_PREDECESSOR_EDGE(edge, this)
    {
        // Peak Memory optimization:
        // These are in an arena, but putting them on the free list greatly reduces
        // the peak memory used by the global optimizer for complex flow graphs.
        BasicBlock *pred = edge->GetPred();
        if (!this->isLoopHeader || this->loop != pred->loop)
        {
            // Skip airlock compensation block as we are not going to walk this block.
            if (pred->isAirLockCompensationBlock)
            {
                pred->DecrementDataUseCount();
                Assert(pred->GetPredList()->HasOne());
                pred = (pred->GetPredList()->Head())->GetPred();
            }

            if (pred->DecrementDataUseCount() == 0 && (!this->loop || this->loop->landingPad != pred))
            {
                if (!(pred->GetSuccList()->HasOne() && this->GetPredList()->HasOne() && this->loop == nullptr))
                {
                    pred->globOptData.DeleteBlockData();
                }
                else
                {
                    pred->globOptData.NullOutBlockData(globOpt, globOpt->func);
                }
            }
        }
    } NEXT_PREDECESSOR_EDGE;

    globOpt->tempBv->ClearAll();
    Assert(!globOpt->IsLoopPrePass());   // We already early return if we are in prepass

    if (this->isLoopHeader)
    {
        Loop *const loop = this->loop;

        // Save values live on loop entry, such that we can adjust the state of the
        // values on the back-edge to match.
        loop->varSymsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->varSymsOnEntry->Copy(this->globOptData.liveVarSyms);

        loop->int32SymsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->int32SymsOnEntry->Copy(this->globOptData.liveInt32Syms);

        loop->lossyInt32SymsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->lossyInt32SymsOnEntry->Copy(this->globOptData.liveLossyInt32Syms);

        loop->float64SymsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->float64SymsOnEntry->Copy(this->globOptData.liveFloat64Syms);

        loop->liveFieldsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->liveFieldsOnEntry->Copy(this->globOptData.liveFields);

        if (symsRequiringCompensationToMergedValueInfoMap.Count() != 0)
        {
            loop->symsRequiringCompensationToMergedValueInfoMap = JitAnew(globOpt->alloc, SymToValueInfoMap, globOpt->alloc);
            loop->symsRequiringCompensationToMergedValueInfoMap->Copy(&symsRequiringCompensationToMergedValueInfoMap);
        }
        
        if(globOpt->DoBoundCheckHoist() && loop->inductionVariables)
        {
            globOpt->FinalizeInductionVariables(loop, &blockData);
            if(globOpt->DoLoopCountBasedBoundCheckHoist())
            {
                globOpt->DetermineDominatingLoopCountableBlock(loop, this);
            }
        }
    }
    else if (!this->loop)
    {
        this->SetDataUseCount(this->GetSuccList()->Count());
    }
    else if(this == this->loop->dominatingLoopCountableBlock)
    {
        globOpt->DetermineLoopCount(this->loop);
    }
}